

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O2

TupleDataGatherFunction *
duckdb::TupleDataCollection::GetGatherFunction
          (TupleDataGatherFunction *__return_storage_ptr__,LogicalType *type)

{
  pointer ppVar1;
  bool bVar2;
  LogicalType *type_00;
  child_list_t<LogicalType> *pcVar3;
  InternalException *this;
  pointer ppVar4;
  allocator local_69;
  undefined1 local_68 [32];
  LogicalType new_type;
  
  if (((type->physical_type_ < 0x1e) && ((0x21800000U >> (type->physical_type_ & 0x1f) & 1) != 0))
     && (bVar2 = TypeVisitor::Contains(type,ARRAY), bVar2)) {
    ArrayType::ConvertToList(&new_type,type);
    (__return_storage_ptr__->child_functions).
    super_vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>.
    super__Vector_base<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->child_functions).
    super_vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>.
    super__Vector_base<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->child_functions).
    super_vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>.
    super__Vector_base<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (new_type.physical_type_ == STRUCT) {
      __return_storage_ptr__->function = TupleDataCastToArrayStructGather;
      pcVar3 = StructType::GetChildTypes_abi_cxx11_(&new_type);
      ppVar1 = (pcVar3->
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar4 = (pcVar3->
                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    ).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1
          ) {
        TupleDataGetGatherFunctionInternal
                  ((TupleDataGatherFunction *)local_68,&ppVar4->second,false);
        ::std::
        vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>::
        emplace_back<duckdb::TupleDataGatherFunction>
                  (&(__return_storage_ptr__->child_functions).
                    super_vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
                   ,(TupleDataGatherFunction *)local_68);
        ::std::
        vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>::
        ~vector((vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
                 *)(local_68 + 8));
      }
    }
    else {
      if (new_type.physical_type_ != LIST) {
        this = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_68,"Unsupported type for TupleDataCollection::GetGatherFunction",
                   &local_69);
        InternalException::InternalException(this,(string *)local_68);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      __return_storage_ptr__->function = TupleDataCastToArrayListGather;
      type_00 = ListType::GetChildType(&new_type);
      TupleDataGetGatherFunctionInternal((TupleDataGatherFunction *)local_68,type_00,true);
      ::std::
      vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>::
      emplace_back<duckdb::TupleDataGatherFunction>
                (&(__return_storage_ptr__->child_functions).
                  super_vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
                 ,(TupleDataGatherFunction *)local_68);
      ::std::
      vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>::
      ~vector((vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
               *)(local_68 + 8));
    }
    LogicalType::~LogicalType(&new_type);
    return __return_storage_ptr__;
  }
  TupleDataGetGatherFunctionInternal(__return_storage_ptr__,type,false);
  return __return_storage_ptr__;
}

Assistant:

TupleDataGatherFunction TupleDataCollection::GetGatherFunction(const LogicalType &type) {
	if (!type.IsNested()) {
		return TupleDataGetGatherFunctionInternal(type, false);
	}

	if (TypeVisitor::Contains(type, LogicalTypeId::ARRAY)) {
		// Special case: we cant handle arrays yet, so we need to replace them with lists when gathering
		const auto new_type = ArrayType::ConvertToList(type);
		TupleDataGatherFunction result;
		// Theres only two cases: Either the array is within a struct, or it is within a list (or has now become a list)
		switch (new_type.InternalType()) {
		case PhysicalType::LIST:
			result.function = TupleDataCastToArrayListGather;
			result.child_functions.push_back(
			    TupleDataGetGatherFunctionInternal(ListType::GetChildType(new_type), true));
			return result;
		case PhysicalType::STRUCT:
			result.function = TupleDataCastToArrayStructGather;
			for (const auto &child_type : StructType::GetChildTypes(new_type)) {
				result.child_functions.push_back(TupleDataGetGatherFunctionInternal(child_type.second, false));
			}
			return result;
		default:
			throw InternalException("Unsupported type for TupleDataCollection::GetGatherFunction");
		}
	}
	return TupleDataGetGatherFunctionInternal(type, false);
}